

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

DS_STATUS ds_list_remove_last(DsList *list,void **pdata)

{
  DsList *local_28;
  DsListEntry **entry;
  void **pdata_local;
  DsList *list_local;
  
  if ((list == (DsList *)0x0) || (local_28 = list, list->entry == (DsListEntry *)0x0)) {
    list_local._4_4_ = DS_STATUS_NULL;
  }
  else {
    while (local_28->entry->next != (DsListEntry *)0x0) {
      local_28 = (DsList *)&local_28->entry->next;
    }
    if (pdata != (void **)0x0) {
      *pdata = local_28->entry->data;
    }
    list->size = list->size - 1;
    list_local._4_4_ = ds_entry_remove(&local_28->entry);
  }
  return list_local._4_4_;
}

Assistant:

DS_STATUS ds_list_remove_last(DsList *list, void **pdata)
{
    if (NULL == list || NULL == list->entry)
        return DS_STATUS_NULL;

    DsListEntry **entry = &list->entry;
    while ((*entry)->next)
        entry = &(*entry)->next;

    if (NULL != pdata)
        *pdata = (*entry)->data;
    (list->size)--;
    return ds_entry_remove(entry);
}